

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O3

void __thiscall CLayerTiles::ExtractTiles(CLayerTiles *this,CTile *pSavedTiles)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < this->m_Height * this->m_Width) {
    lVar1 = 0;
    do {
      lVar1 = (long)(int)lVar1;
      uVar2 = 0xffffffff;
      do {
        uVar3 = (long)this->m_Height * (long)this->m_Width;
        if ((long)uVar3 <= lVar1) goto LAB_001a6349;
        this->m_pTiles[lVar1] = *pSavedTiles;
        this->m_pTiles[lVar1].m_Skip = '\0';
        lVar1 = lVar1 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < pSavedTiles->m_Skip);
      uVar3 = (ulong)(uint)(this->m_Height * this->m_Width);
LAB_001a6349:
      pSavedTiles = pSavedTiles + 1;
    } while ((int)lVar1 < (int)uVar3);
  }
  return;
}

Assistant:

void CLayerTiles::ExtractTiles(CTile *pSavedTiles)
{
	int i = 0;
	while(i < m_Width * m_Height)
	{
		for(unsigned Counter = 0; Counter <= pSavedTiles->m_Skip && i < m_Width * m_Height; Counter++)
		{
			m_pTiles[i] = *pSavedTiles;
			m_pTiles[i++].m_Skip = 0;
		}

		pSavedTiles++;
	}
}